

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

char * aux_upvalue(StkId fi,int n,TValue **val,GCObject **owner)

{
  GCObject *pGVar1;
  lua_CFunction p_Var2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = fi->tt_ & 0x3f;
  if (uVar4 == 6) {
    if (0 < n) {
      p_Var2 = (fi->value_).f;
      lVar3 = *(long *)(p_Var2 + 0x18);
      if (n <= *(int *)(lVar3 + 0x50)) {
        uVar5 = (ulong)(n - 1);
        *val = *(TValue **)(*(long *)(p_Var2 + uVar5 * 8 + 0x20) + 0x10);
        if (owner != (GCObject **)0x0) {
          *owner = *(GCObject **)(p_Var2 + uVar5 * 8 + 0x20);
        }
        lVar3 = *(long *)(*(long *)(lVar3 + 0x38) + uVar5 * 0x10);
        if (lVar3 == 0) {
          return "";
        }
        return (char *)(lVar3 + 0x18);
      }
    }
  }
  else if (((uVar4 == 0x26) && (0 < n)) &&
          (pGVar1 = (GCObject *)(fi->value_).f, (uint)n <= (uint)(pGVar1->h).flags)) {
    *val = (TValue *)((long)pGVar1 + (ulong)(n - 1) * 0x10 + 0x20);
    if (owner == (GCObject **)0x0) {
      return "";
    }
    *owner = pGVar1;
    return "";
  }
  return (char *)0x0;
}

Assistant:

static const char *aux_upvalue (StkId fi, int n, TValue **val,
                                GCObject **owner) {
  switch (ttype(fi)) {
    case LUA_TCCL: {  /* C closure */
      CClosure *f = clCvalue(fi);
      if (!(1 <= n && n <= f->nupvalues)) return NULL;
      *val = &f->upvalue[n-1];
      if (owner) *owner = obj2gco(f);
      return "";
    }
    case LUA_TLCL: {  /* Lua closure */
      LClosure *f = clLvalue(fi);
      TString *name;
      Proto *p = f->p;
      if (!(1 <= n && n <= p->sizeupvalues)) return NULL;
      *val = f->upvals[n-1]->v;
      if (owner) *owner = obj2gco(f->upvals[n - 1]);
      name = p->upvalues[n-1].name;
      return (name == NULL) ? "" : getstr(name);
    }
    default: return NULL;  /* not a closure */
  }
}